

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_key_value_api_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_75a36::BaseKeyValAPI::TearDown(BaseKeyValAPI *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_ctx_t *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  aom_codec_err_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Type in_stack_ffffffffffffffac;
  Type type;
  AssertHelper *in_stack_ffffffffffffffb0;
  AssertionResult local_18;
  Message *message;
  
  message = in_RDI;
  aom_codec_destroy(in_stack_ffffffffffffff78);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(char *)in_RDI,
             in_stack_ffffffffffffff88,(aom_codec_err_t *)in_stack_ffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff88 =
         (aom_codec_err_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3b870e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,(char *)in_RDI);
    testing::internal::AssertHelper::operator=(unaff_retaddr,message);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff80);
    testing::Message::~Message((Message *)0x3b875c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b87af);
  type = kSuccess;
  aom_codec_destroy(in_stack_ffffffffffffff78);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(char *)in_RDI,
             in_stack_ffffffffffffff88,(aom_codec_err_t *)in_stack_ffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3b8825)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffb0,type,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               (char *)in_RDI);
    testing::internal::AssertHelper::operator=(unaff_retaddr,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x3b8873);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b88c3);
  return;
}

Assistant:

void TearDown() override {
#if CONFIG_AV1_ENCODER
    EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc_));
#endif
#if CONFIG_AV1_DECODER
    EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&dec_));
#endif
  }